

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calculateEdgeDerivatives
          (BeagleCPUImpl<float,_1,_0> *this,int *postBufferIndices,int *preBufferIndices,
          int *derivativeMatrixIndices,int *categoryWeightsIndices,int *categoryRatesIndices,
          int *cumulativeScaleIndices,int count,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  int iVar1;
  
  iVar1 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x36])();
  return iVar1;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calculateEdgeDerivatives(const int *postBufferIndices,
                                                                   const int *preBufferIndices,
                                                                   const int *derivativeMatrixIndices,
                                                                   const int *categoryWeightsIndices,
                                                                   const int *categoryRatesIndices,
                                                                   const int *cumulativeScaleIndices,
                                                                   int count,
                                                                   double *outDerivatives,
                                                                   double *outSumDerivatives,
                                                                   double *outSumSquaredDerivatives) {
    return calcEdgeLogDerivatives(
            postBufferIndices, preBufferIndices,
            derivativeMatrixIndices, NULL,
            categoryWeightsIndices,categoryRatesIndices, cumulativeScaleIndices,
            count,
            outDerivatives,
            outSumDerivatives, outSumSquaredDerivatives);
}